

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
BoundedAddBind(ClientContext *context,ScalarFunction *bound_function,
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *arguments)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this;
  undefined8 uVar2;
  undefined8 uVar3;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var4;
  char cVar5;
  int32_t iVar6;
  reference pvVar7;
  pointer pEVar8;
  reference pvVar9;
  BinderException *this_00;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  int32_t local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_50;
  LogicalType local_48 [24];
  
  this = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *)CONCAT71(in_register_00000009,in_CL);
  BoundedType::GetDefault();
  pvVar7 = duckdb::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this,0);
  pEVar8 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
           operator->(pvVar7);
  cVar5 = duckdb::LogicalType::operator==((LogicalType *)&local_88,(LogicalType *)(pEVar8 + 0x38));
  if (cVar5 == '\0') {
    cVar5 = '\0';
  }
  else {
    BoundedType::GetDefault();
    pvVar7 = duckdb::
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](this,1);
    pEVar8 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar7);
    cVar5 = duckdb::LogicalType::operator==(local_48,(LogicalType *)(pEVar8 + 0x38));
    duckdb::LogicalType::~LogicalType(local_48);
  }
  local_50._M_head_impl = (FunctionData *)context;
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_88);
  if (cVar5 == '\0') {
    this_00 = (BinderException *)__cxa_allocate_exception(0x10);
    local_88 = &uStack_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"bounded_add expects two BOUNDED types","");
    duckdb::BinderException::BinderException(this_00,(string *)&local_88);
    __cxa_throw(this_00,&duckdb::BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar7 = duckdb::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this,0);
  pEVar8 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
           operator->(pvVar7);
  local_68 = BoundedType::GetMaxValue((LogicalType *)(pEVar8 + 0x38));
  pvVar7 = duckdb::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this,1);
  pEVar8 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
           operator->(pvVar7);
  iVar6 = BoundedType::GetMaxValue((LogicalType *)(pEVar8 + 0x38));
  pvVar7 = duckdb::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this,0);
  pEVar8 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
           operator->(pvVar7);
  pvVar9 = duckdb::vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)(arguments + 0x48),0);
  if (pvVar9 != (reference)(pEVar8 + 0x38)) {
    *pvVar9 = (value_type)pEVar8[0x38];
    *(Expression *)(pvVar9 + 1) = pEVar8[0x39];
    duckdb::shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar9 + 8),
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar8 + 0x40));
  }
  iVar10 = iVar6 + local_68;
  pvVar7 = duckdb::
           vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this,1);
  pEVar8 = duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
           operator->(pvVar7);
  pvVar9 = duckdb::vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)(arguments + 0x48),1);
  if (pvVar9 != (reference)(pEVar8 + 0x38)) {
    *pvVar9 = (value_type)pEVar8[0x38];
    *(Expression *)(pvVar9 + 1) = pEVar8[0x39];
    duckdb::shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar9 + 8),
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pEVar8 + 0x40));
  }
  BoundedType::Get((BoundedType *)&local_88,iVar10);
  uVar3 = uStack_78;
  uVar2 = local_80;
  arguments[0x90] = local_88._0_1_;
  arguments[0x91] = local_88._1_1_;
  iVar10 = *(int *)(arguments + 0x98);
  uVar12 = *(undefined4 *)(arguments + 0xa0);
  *(undefined8 *)(arguments + 0x98) = 0;
  *(undefined8 *)(arguments + 0xa0) = 0;
  local_80 = 0;
  uStack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(arguments + 0xa0);
  *(undefined8 *)(arguments + 0x98) = uVar2;
  *(undefined8 *)(arguments + 0xa0) = uVar3;
  uVar11 = *(undefined4 *)(arguments + 0x9c);
  uVar13 = *(undefined4 *)(arguments + 0xa4);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_68 = iVar10;
    uStack_64 = *(undefined4 *)(arguments + 0x9c);
    uStack_60 = uVar12;
    uStack_5c = *(undefined4 *)(arguments + 0xa4);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    iVar10 = local_68;
    uVar11 = uStack_64;
    uVar12 = uStack_60;
    uVar13 = uStack_5c;
  }
  _Var4._M_head_impl = local_50._M_head_impl;
  p_Var1 = uStack_78;
  local_80 = CONCAT44(uVar11,iVar10);
  uStack_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar13,uVar12);
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_88);
  *(undefined8 *)_Var4._M_head_impl = 0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         _Var4._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> BoundedAddBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	if (BoundedType::GetDefault() == arguments[0]->return_type &&
	    BoundedType::GetDefault() == arguments[1]->return_type) {
		auto left_max_val = BoundedType::GetMaxValue(arguments[0]->return_type);
		auto right_max_val = BoundedType::GetMaxValue(arguments[1]->return_type);

		auto new_max_val = left_max_val + right_max_val;
		bound_function.arguments[0] = arguments[0]->return_type;
		bound_function.arguments[1] = arguments[1]->return_type;
		bound_function.return_type = BoundedType::Get(new_max_val);
	} else {
		throw BinderException("bounded_add expects two BOUNDED types");
	}
	return nullptr;
}